

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash.cpp
# Opt level: O0

uint64_t MurmurHash64B(void *key,int len,uint seed)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  uint64_t h;
  uint k1_1;
  uint k2;
  uint k1;
  uint *data;
  uint h2;
  uint h1;
  int r;
  uint m;
  uint seed_local;
  int len_local;
  void *key_local;
  
  data._4_4_ = seed ^ len;
  data._0_4_ = 0;
  _k2 = (byte *)key;
  for (m = len; 7 < (int)m; m = m - 8) {
    pbVar3 = _k2 + 4;
    data._4_4_ = ((uint)(*(int *)_k2 * 0x5bd1e995) >> 0x18 ^ *(int *)_k2 * 0x5bd1e995) * 0x5bd1e995
                 ^ data._4_4_ * 0x5bd1e995;
    _k2 = _k2 + 8;
    data._0_4_ = ((uint)(*(int *)pbVar3 * 0x5bd1e995) >> 0x18 ^ *(int *)pbVar3 * 0x5bd1e995) *
                 0x5bd1e995 ^ (uint)data * 0x5bd1e995;
  }
  if (3 < (int)m) {
    data._4_4_ = ((uint)(*(int *)_k2 * 0x5bd1e995) >> 0x18 ^ *(int *)_k2 * 0x5bd1e995) * 0x5bd1e995
                 ^ data._4_4_ * 0x5bd1e995;
    m = m - 4;
    _k2 = _k2 + 4;
  }
  if (m != 1) {
    if (m != 2) {
      if (m != 3) goto LAB_00120953;
      data._0_4_ = (uint)_k2[2] << 0x10 ^ (uint)data;
    }
    data._0_4_ = (uint)_k2[1] << 8 ^ (uint)data;
  }
  data._0_4_ = (*_k2 ^ (uint)data) * 0x5bd1e995;
LAB_00120953:
  uVar1 = ((uint)data >> 0x12 ^ data._4_4_) * 0x5bd1e995;
  uVar2 = (uVar1 >> 0x16 ^ (uint)data) * 0x5bd1e995;
  uVar1 = (uVar2 >> 0x11 ^ uVar1) * 0x5bd1e995;
  return CONCAT44(uVar1,(uVar1 >> 0x13 ^ uVar2) * 0x5bd1e995);
}

Assistant:

uint64_t MurmurHash64B(const void *key, int len, unsigned int seed) {
    const unsigned int m = 0x5bd1e995;
    const int r = 24;

    unsigned int h1 = seed ^len;
    unsigned int h2 = 0;

    const unsigned int *data = (const unsigned int *) key;

    while (len >= 8) {
        unsigned int k1 = *data++;
        k1 *= m;
        k1 ^= k1 >> r;
        k1 *= m;
        h1 *= m;
        h1 ^= k1;
        len -= 4;

        unsigned int k2 = *data++;
        k2 *= m;
        k2 ^= k2 >> r;
        k2 *= m;
        h2 *= m;
        h2 ^= k2;
        len -= 4;
    }

    if (len >= 4) {
        unsigned int k1 = *data++;
        k1 *= m;
        k1 ^= k1 >> r;
        k1 *= m;
        h1 *= m;
        h1 ^= k1;
        len -= 4;
    }

    switch (len) {
        case 3:
            h2 ^= ((unsigned char *) data)[2] << 16;
        case 2:
            h2 ^= ((unsigned char *) data)[1] << 8;
        case 1:
            h2 ^= ((unsigned char *) data)[0];
            h2 *= m;
    };

    h1 ^= h2 >> 18;
    h1 *= m;
    h2 ^= h1 >> 22;
    h2 *= m;
    h1 ^= h2 >> 17;
    h1 *= m;
    h2 ^= h1 >> 19;
    h2 *= m;

    uint64_t h = h1;

    h = (h << 32) | h2;

    return h;
}